

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O2

void Cnf_CollectVolume(Aig_Man_t *p,Aig_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes)

{
  void *pvVar1;
  int i;
  
  Aig_ManIncrementTravId(p);
  for (i = 0; i < vLeaves->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(vLeaves,i);
    *(int *)((long)pvVar1 + 0x20) = p->nTravIds;
  }
  vNodes->nSize = 0;
  Cnf_CollectVolume_rec(p,pRoot,vNodes);
  return;
}

Assistant:

void Cnf_CollectVolume( Aig_Man_t * p, Aig_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    Vec_PtrClear( vNodes );
    Cnf_CollectVolume_rec( p, pRoot, vNodes );
}